

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O2

int MPIABI_Testall(int count,MPIABI_Request *array_of_requests,int *flag,
                  MPIABI_Status *array_of_statuses)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  anon_union_24_2_44bf1552_for_mpi_status *paVar11;
  anon_union_24_2_44bf1552_for_mpi_status *paVar12;
  ulong uVar13;
  undefined8 *puVar14;
  
  uVar13 = (ulong)(uint)count;
  if (array_of_statuses != (MPIABI_Status *)0x0) {
    lVar8 = 0;
    uVar9 = 0;
    if (0 < count) {
      uVar9 = uVar13;
    }
    puVar14 = (undefined8 *)((long)&array_of_statuses->mpi_status + 0xc);
    for (; uVar9 * 0x28 - lVar8 != 0; lVar8 = lVar8 + 0x28) {
      uVar1 = *(undefined4 *)((long)&array_of_statuses->mpi_status + lVar8 + 0x14);
      uVar4 = *(undefined8 *)((long)&array_of_statuses->mpi_status + lVar8 + 0xc);
      uVar2 = *(undefined4 *)((long)&array_of_statuses->MPI_ERROR + lVar8);
      *(undefined8 *)((long)puVar14 + -0xc) =
           *(undefined8 *)((long)&array_of_statuses->MPI_SOURCE + lVar8);
      *(undefined4 *)((long)puVar14 + -4) = uVar2;
      *puVar14 = uVar4;
      *(undefined4 *)(puVar14 + 1) = uVar1;
      puVar14 = puVar14 + 3;
    }
  }
  iVar7 = MPI_Testall(uVar13,array_of_requests,flag,array_of_statuses);
  if (array_of_statuses != (MPIABI_Status *)0x0) {
    piVar10 = &array_of_statuses[uVar13 - 1].MPI_ERROR;
    paVar12 = &array_of_statuses->mpi_status + uVar13;
    while( true ) {
      paVar11 = paVar12 + -1;
      if ((int)uVar13 < 1) break;
      iVar3 = *(int *)((long)paVar12 + -0x10);
      uVar4 = *(undefined8 *)paVar11;
      uVar5 = *(undefined8 *)paVar11;
      uVar6 = *(undefined8 *)((long)paVar12 + -0x10);
      *(undefined8 *)(piVar10 + -4) = *(undefined8 *)((long)paVar12 + -8);
      *(undefined8 *)&((MPIABI_Status *)(piVar10 + -8))->mpi_status = uVar5;
      *(undefined8 *)(piVar10 + -6) = uVar6;
      *(undefined8 *)(piVar10 + -2) = uVar4;
      *piVar10 = iVar3;
      uVar13 = (ulong)((int)uVar13 - 1);
      piVar10 = piVar10 + -10;
      paVar12 = paVar11;
    }
  }
  return iVar7;
}

Assistant:

int MPIABI_Testall(int count, MPIABI_Request array_of_requests[],
                              int *flag, MPIABI_Status array_of_statuses[]) {
  const bool ignore_statuses =
      (MPI_Status *)array_of_statuses == MPI_STATUSES_IGNORE;
  MPI_Request *const reqs = (MPI_Request *)(void *)array_of_requests;
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = 0; i < count; ++i)
      reqs[i] = (WPI_Request)array_of_requests[i];
  MPI_Status *const stats = (MPI_Status *)(void *)array_of_statuses;
  if (!ignore_statuses)
    for (int i = 0; i < count; ++i)
      stats[i] = (WPI_Status)array_of_statuses[i];
  const int ierr = MPI_Testall(count, reqs, flag, stats);
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = count - 1; i >= 0; --i)
      array_of_requests[i] = (WPI_Request)reqs[i];
  if (!ignore_statuses)
    for (int i = count - 1; i >= 0; --i)
      array_of_statuses[i] = (WPI_Status)stats[i];
  return ierr;
}